

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool VW::is_ring_example(vw *all,example *ae)

{
  bool bVar1;
  example *unaff_retaddr;
  
  bVar1 = object_pool<example,_example_initializer>::is_from_pool
                    ((object_pool<example,_example_initializer> *)ae,unaff_retaddr);
  return bVar1;
}

Assistant:

bool is_ring_example(vw& all, example* ae) { return all.p->example_pool.is_from_pool(ae); }